

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

Function * __thiscall runtime::Heap::NewFunction(Heap *this)

{
  size_t *psVar1;
  Function *pFVar2;
  _List_node_base *p_Var3;
  
  pFVar2 = (Function *)operator_new(0x30);
  (pFVar2->scopeOuter).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pFVar2->fn = (Function *)0x0;
  (pFVar2->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pFVar2->scopeOuter).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pFVar2->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar2->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)pFVar2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->createdFunctions).
            super__List_base<runtime::Function_*,_std::allocator<runtime::Function_*>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return pFVar2;
}

Assistant:

runtime::Function* runtime::Heap::NewFunction() noexcept {
  auto ret = new runtime::Function{};
  this->createdFunctions.push_back(ret);
  return ret;
}